

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          *lhs,unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
               *rhs)

{
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  *value;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  AssertionResult AVar2;
  string local_68;
  string local_48;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  
  PrintToString<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
            (&local_68,(testing *)lhs,
             (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
              *)rhs_expression);
  PrintToString<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
            (&local_48,(testing *)rhs,value);
  AVar2 = EqFailure(this,lhs_expression,rhs_expression,&local_68,&local_48,false);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var1 = extraout_RDX.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var1._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}